

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate_boolean
               (xpath_node_set_raw *ns,size_t first,xpath_ast_node *expr,xpath_stack *stack,
               bool once)

{
  bool bVar1;
  xpath_node *pxVar2;
  xml_node_struct *extraout_RDX;
  xpath_node *pxVar3;
  xml_node_struct *__length;
  long in_RSI;
  xpath_node_set_raw *in_RDI;
  byte in_R8B;
  xpath_context c;
  xpath_node *it;
  xpath_node *last;
  size_t size;
  size_t i;
  xpath_stack *in_stack_000001c8;
  xpath_context *in_stack_000001d0;
  xpath_ast_node *in_stack_000001d8;
  xpath_context local_68;
  xpath_node *local_48;
  xpath_node *local_40;
  size_t local_38;
  size_t local_30;
  byte local_21;
  long local_10;
  xpath_node_set_raw *local_8;
  
  local_21 = in_R8B & 1;
  local_30 = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = xpath_node_set_raw::size(in_RDI);
  local_38 = local_38 - local_10;
  local_48 = xpath_node_set_raw::begin(local_8);
  local_48 = local_48 + local_10;
  local_40 = local_48;
  for (; pxVar3 = local_48, pxVar2 = xpath_node_set_raw::end(local_8), __length = extraout_RDX,
      pxVar3 != pxVar2; local_48 = local_48 + 1) {
    xpath_context::xpath_context(&local_68,local_48,local_30,local_38);
    bVar1 = eval_boolean(in_stack_000001d8,in_stack_000001d0,in_stack_000001c8);
    if (bVar1) {
      pxVar3 = local_40 + 1;
      __length = (local_48->_node)._root;
      (local_40->_node)._root = __length;
      (local_40->_attribute)._attr = (local_48->_attribute)._attr;
      local_40 = pxVar3;
      if ((local_21 & 1) != 0) break;
    }
    local_30 = local_30 + 1;
  }
  xpath_node_set_raw::truncate(local_8,(char *)local_40,(__off_t)__length);
  return;
}

Assistant:

static void apply_predicate_boolean(xpath_node_set_raw& ns, size_t first, xpath_ast_node* expr, const xpath_stack& stack, bool once)
		{
			assert(ns.size() >= first);
			assert(expr->rettype() != xpath_type_number);

			size_t i = 1;
			size_t size = ns.size() - first;

			xpath_node* last = ns.begin() + first;

			// remove_if... or well, sort of
			for (xpath_node* it = last; it != ns.end(); ++it, ++i)
			{
				xpath_context c(*it, i, size);

				if (expr->eval_boolean(c, stack))
				{
					*last++ = *it;

					if (once) break;
				}
			}

			ns.truncate(last);
		}